

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

uint32_t getTagNumber(char *tagname)

{
  int iVar1;
  uint32_t tagNum;
  ulong uVar2;
  
  if (gMainTable.tagList != (uint16_t *)0x0) {
    for (uVar2 = 0; uVar2 < gMainTable.tagListSize; uVar2 = uVar2 + 1) {
      iVar1 = uprv_stricmp_63((char *)((ulong)((uint)gMainTable.tagList[uVar2] * 2) +
                                      (long)gMainTable.stringTable),tagname);
      if (iVar1 == 0) {
        return (uint32_t)uVar2;
      }
    }
  }
  return 0xffffffff;
}

Assistant:

static uint32_t getTagNumber(const char *tagname) {
    if (gMainTable.tagList) {
        uint32_t tagNum;
        for (tagNum = 0; tagNum < gMainTable.tagListSize; tagNum++) {
            if (!uprv_stricmp(GET_STRING(gMainTable.tagList[tagNum]), tagname)) {
                return tagNum;
            }
        }
    }

    return UINT32_MAX;
}